

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction_base.cpp
# Opt level: O2

TransactionController *
cfd::api::TransactionApiBase::AddSign<cfd::TransactionController>
          (TransactionController *__return_storage_ptr__,
          function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *create_controller,string *hex,Txid *txid,uint32_t vout,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_params,
          bool is_witness,bool clear_stack)

{
  pointer pSVar1;
  bool bVar2;
  CfdException *this;
  byte bVar3;
  ScriptElement *element;
  ScriptElement *element_00;
  pointer pSVar4;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> sign_stack;
  ScriptBuilder builder;
  ScriptOperator op_code;
  Script local_c8;
  Script script;
  
  if (hex->_M_string_length != 0) {
    std::
    function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(__return_storage_ptr__,create_controller,hex);
    sign_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    sign_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    sign_stack.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pSVar1 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    bVar3 = 0;
    for (pSVar4 = (sign_params->
                  super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                  _M_impl.super__Vector_impl_data._M_start; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
      bVar2 = SignParameter::IsOpCode(pSVar4);
      if (bVar2) {
        SignParameter::GetOpCode(&op_code,pSVar4);
        bVar2 = core::ScriptOperator::IsPushOperator(&op_code);
        bVar3 = bVar3 | bVar2;
        core::ScriptOperator::~ScriptOperator(&op_code);
      }
      SignParameter::ConvertToSignature((ByteData *)&op_code,pSVar4);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
      emplace_back<cfd::core::ByteData>(&sign_stack,(ByteData *)&op_code);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&op_code);
    }
    if (is_witness) {
      if (clear_stack) {
        TransactionController::RemoveWitnessStackAll(__return_storage_ptr__,txid,vout);
      }
      TransactionController::AddWitnessStack(__return_storage_ptr__,txid,vout,&sign_stack);
    }
    else if (bVar3 == 0) {
      if (clear_stack) {
        TransactionController::SetUnlockingScript(__return_storage_ptr__,txid,vout,&sign_stack);
      }
      else {
        TransactionController::InsertUnlockingScript(__return_storage_ptr__,txid,vout,&sign_stack);
      }
    }
    else {
      core::Script::Script(&script);
      if (!clear_stack) {
        TransactionController::GetTxIn((TxInReference *)&op_code,__return_storage_ptr__,txid,vout);
        core::Script::Script((Script *)&builder,&local_c8);
        core::Script::operator=(&script,(Script *)&builder);
        core::Script::~Script((Script *)&builder);
        core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)&op_code);
      }
      builder._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00781d68;
      builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      core::Script::GetElementList
                ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                 &op_code,&script);
      for (element_00 = (ScriptElement *)op_code._vptr_ScriptOperator;
          element_00 != (ScriptElement *)CONCAT44(op_code._12_4_,op_code.data_type_);
          element_00 = element_00 + 1) {
        core::ScriptBuilder::AppendElement(&builder,element_00);
      }
      std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                 &op_code);
      pSVar1 = (sign_params->
               super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pSVar4 = (sign_params->
                    super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                    _M_impl.super__Vector_impl_data._M_start; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1)
      {
        bVar2 = SignParameter::IsOpCode(pSVar4);
        if (bVar2) {
          SignParameter::GetOpCode(&op_code,pSVar4);
          core::ScriptBuilder::AppendOperator(&builder,&op_code);
          core::ScriptOperator::~ScriptOperator(&op_code);
        }
        else {
          SignParameter::ConvertToSignature((ByteData *)&op_code,pSVar4);
          core::ScriptBuilder::AppendData(&builder,(ByteData *)&op_code);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&op_code);
        }
      }
      core::ScriptBuilder::Build((Script *)&op_code,&builder);
      TransactionController::SetUnlockingScript(__return_storage_ptr__,txid,vout,(Script *)&op_code)
      ;
      core::Script::~Script((Script *)&op_code);
      core::ScriptBuilder::~ScriptBuilder(&builder);
      core::Script::~Script(&script);
    }
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&sign_stack);
    return __return_storage_ptr__;
  }
  op_code._vptr_ScriptOperator = (_func_int **)0x52242c;
  op_code.data_type_ = kOpGreaterThanOrEqual64;
  op_code.text_data_._M_dataplus._M_p = "AddSign";
  core::logger::warn<std::__cxx11::string_const&>
            ((CfdSourceLocation *)&op_code,
             "Failed to AddSign. Invalid hex string. empty data. tx=[{}]",hex);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&op_code,"Invalid hex string. empty data.",(allocator *)&script);
  core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&op_code);
  __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

T TransactionApiBase::AddSign(
    std::function<T(const std::string&)> create_controller,
    const std::string& hex, const Txid& txid, uint32_t vout,
    const std::vector<SignParameter>& sign_params, bool is_witness,
    bool clear_stack) {
  if (hex.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to AddSign. Invalid hex string. empty data. tx=[{}]", hex);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid hex string. empty data.");
  }

  // TransactionController作成
  T txc = create_controller(hex);

  std::vector<ByteData> sign_stack;
  bool has_op_code = false;
  for (const SignParameter& sign_param : sign_params) {
    if (sign_param.IsOpCode()) {
      ScriptOperator op_code = sign_param.GetOpCode();
      if (op_code.IsPushOperator()) {
        has_op_code = true;
      }
    }
    sign_stack.push_back(sign_param.ConvertToSignature());
  }

  if (is_witness) {
    if (clear_stack) {
      txc.RemoveWitnessStackAll(txid, vout);
    }
    txc.AddWitnessStack(txid, vout, sign_stack);
  } else if (!has_op_code) {
    if (clear_stack) {
      txc.SetUnlockingScript(txid, vout, sign_stack);
    } else {
      txc.InsertUnlockingScript(txid, vout, sign_stack);
    }
  } else {
    Script script;
    if (!clear_stack) {
      script = txc.GetTxIn(txid, vout).GetUnlockingScript();
    }
    ScriptBuilder builder;
    for (const auto& element : script.GetElementList()) {
      builder.AppendElement(element);
    }
    for (const SignParameter& sign_param : sign_params) {
      if (sign_param.IsOpCode()) {
        // Checking push-operator is performed at the time of registration.
        builder.AppendOperator(sign_param.GetOpCode());
      } else {
        builder.AppendData(sign_param.ConvertToSignature());
      }
    }
    txc.SetUnlockingScript(txid, vout, builder.Build());
  }

  return txc;
}